

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_0::checkForRequiredDecoration
               (uint32_t struct_id,function<bool_(spv::Decoration)> *checker,Op type,
               ValidationState_t *vstate)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar5;
  _Base_ptr p_Var6;
  ValidationState_t *vstate_00;
  size_t memberIdx;
  ValidationState_t *pVVar7;
  pointer puVar8;
  byte bVar9;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Any_data local_50;
  code *local_40;
  
  getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,struct_id,vstate
                  );
  pVVar7 = (ValidationState_t *)0x0;
  while( true ) {
    vstate_00 = (ValidationState_t *)
                ((long)local_80._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80._M_impl.super__Vector_impl_data._M_start >> 2);
    if (vstate_00 <= pVVar7) break;
    uVar3 = local_80._M_impl.super__Vector_impl_data._M_start[(long)pVVar7];
    if (type == OpTypeMatrix) {
      while( true ) {
        pIVar4 = ValidationState_t::FindDef(vstate,uVar3);
        if (((pIVar4->inst_).opcode & 0xfffe) != 0x1c) break;
        uVar3 = Instruction::GetOperandAs<unsigned_int>(pIVar4,1);
      }
      uVar3 = (pIVar4->inst_).result_id;
    }
    pIVar4 = ValidationState_t::FindDef(vstate,uVar3);
    if ((pIVar4->inst_).opcode == type) {
      psVar5 = ValidationState_t::id_decorations(vstate,uVar3);
      bVar9 = 0;
      for (p_Var6 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        bVar1 = std::function<bool_(spv::Decoration)>::operator()(checker,p_Var6[1]._M_color);
        bVar9 = bVar9 | bVar1;
      }
      psVar5 = ValidationState_t::id_decorations(vstate,struct_id);
      for (p_Var6 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        bVar1 = std::function<bool_(spv::Decoration)>::operator()(checker,p_Var6[1]._M_color);
        if (bVar1) {
          bVar9 = bVar9 | p_Var6[2]._M_color == (_Rb_tree_color)pVVar7;
        }
      }
      if (bVar9 == 0) {
        bVar1 = false;
        goto LAB_00571d4b;
      }
    }
    pVVar7 = (ValidationState_t *)((long)&pVVar7->context_ + 1);
  }
  getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,struct_id,
                   (Op)vstate,vstate_00);
  puVar8 = local_68._M_impl.super__Vector_impl_data._M_start;
  do {
    bVar1 = puVar8 == local_68._M_impl.super__Vector_impl_data._M_finish;
    if (bVar1) break;
    uVar3 = *puVar8;
    std::function<bool_(spv::Decoration)>::function
              ((function<bool_(spv::Decoration)> *)&local_50,checker);
    bVar2 = checkForRequiredDecoration
                      (uVar3,(function<bool_(spv::Decoration)> *)&local_50,type,vstate);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    puVar8 = puVar8 + 1;
  } while (bVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
LAB_00571d4b:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_80);
  return bVar1;
}

Assistant:

bool checkForRequiredDecoration(uint32_t struct_id,
                                std::function<bool(spv::Decoration)> checker,
                                spv::Op type, ValidationState_t& vstate) {
  const auto& members = getStructMembers(struct_id, vstate);
  for (size_t memberIdx = 0; memberIdx < members.size(); memberIdx++) {
    auto id = members[memberIdx];
    if (type == spv::Op::OpTypeMatrix) {
      // Matrix decorations also apply to arrays of matrices.
      auto memberInst = vstate.FindDef(id);
      while (memberInst->opcode() == spv::Op::OpTypeArray ||
             memberInst->opcode() == spv::Op::OpTypeRuntimeArray) {
        memberInst = vstate.FindDef(memberInst->GetOperandAs<uint32_t>(1u));
      }
      id = memberInst->id();
    }
    if (type != vstate.FindDef(id)->opcode()) continue;
    bool found = false;
    for (auto& dec : vstate.id_decorations(id)) {
      if (checker(dec.dec_type())) found = true;
    }
    for (auto& dec : vstate.id_decorations(struct_id)) {
      if (checker(dec.dec_type()) &&
          (int)memberIdx == dec.struct_member_index()) {
        found = true;
      }
    }
    if (!found) {
      return false;
    }
  }
  for (auto id : getStructMembers(struct_id, spv::Op::OpTypeStruct, vstate)) {
    if (!checkForRequiredDecoration(id, checker, type, vstate)) {
      return false;
    }
  }
  return true;
}